

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O2

bool tinyusdz::io::ReadFileHeader
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *err,
               string *filepath,uint32_t max_read_bytes,void *userdata)

{
  ulong uVar1;
  reference pvVar2;
  bool bVar3;
  uint32_t uVar4;
  char *pcVar5;
  ulong __new_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream f;
  byte abStack_218 [488];
  
  uVar4 = 0x100000;
  if (max_read_bytes < 0x100000) {
    uVar4 = max_read_bytes;
  }
  ::std::ifstream::ifstream(&f,(filepath->_M_dataplus)._M_p,_S_bin);
  if ((abStack_218[*(long *)(_f + -0x18)] & 5) == 0) {
    ::std::istream::peek();
    if ((abStack_218[*(long *)(_f + -0x18)] & 5) == 0) {
      ::std::istream::seekg((long)&f,_S_beg);
      uVar1 = ::std::istream::tellg();
      ::std::istream::seekg((long)&f,_S_beg);
      if ((long)uVar1 < 0) {
        if (err != (string *)0x0) {
          ::std::operator+(&bStack_278,"Invalid file size : ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           filepath);
          pcVar5 = " (does the path point to a directory?)";
          goto LAB_00232907;
        }
      }
      else if (uVar1 == 0x7fffffffffffffff) {
        if (err != (string *)0x0) {
          pcVar5 = "Invalid File(Pipe or special device?) : ";
          goto LAB_002328f2;
        }
      }
      else if (uVar1 == 0) {
        if (err != (string *)0x0) {
          pcVar5 = "File is empty : ";
          goto LAB_002328f2;
        }
      }
      else {
        __new_size = (ulong)(uVar4 + (uVar4 == 0));
        if (uVar1 < __new_size) {
          __new_size = uVar1;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)out,__new_size);
        pvVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(out,0);
        ::std::istream::read((char *)&f,(long)pvVar2);
        if ((abStack_218[*(long *)(_f + -0x18)] & 5) == 0) {
          bVar3 = true;
          goto LAB_00232934;
        }
        if (err != (string *)0x0) {
          pcVar5 = "Failed to read file: ";
          goto LAB_002328f2;
        }
      }
    }
    else if (err != (string *)0x0) {
      pcVar5 = "File read error. Maybe empty file or invalid file : ";
      goto LAB_002328f2;
    }
  }
  else if (err != (string *)0x0) {
    pcVar5 = "File does not exit or open error : ";
LAB_002328f2:
    ::std::operator+(&bStack_278,pcVar5,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filepath);
    pcVar5 = "\n";
LAB_00232907:
    ::std::operator+(&local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &bStack_278,pcVar5);
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  bVar3 = false;
LAB_00232934:
  ::std::ifstream::~ifstream(&f);
  return bVar3;
}

Assistant:

bool ReadFileHeader(std::vector<uint8_t> *out, std::string *err,
                    const std::string &filepath, uint32_t max_read_bytes,
                    void *userdata) {
  (void)userdata;

  // hard limit to 1MB.
  max_read_bytes =
      (std::max)(1u, (std::min)(uint32_t(1024 * 1024), max_read_bytes));

#ifdef TINYUSDZ_ANDROID_LOAD_FROM_ASSETS
  if (tinyusdz::io::asset_manager) {
    AAsset *asset = AAssetManager_open(asset_manager, filepath.c_str(),
                                       AASSET_MODE_STREAMING);
    if (!asset) {
      if (err) {
        (*err) += "File open error(from AssestManager) : " + filepath + "\n";
      }
      return false;
    }
    off_t len = AAsset_getLength(asset);
    if (len <= 0) {
      if (err) {
        (*err) += "Invalid file size : " + filepath +
                  " (does the path point to a directory?)";
      }
      return false;
    }

    size_t size = size_t(len);

    size = (std::min)(size_t(max_read_bytes), size);
    out->resize(size);
    AAsset_read(asset, reinterpret_cast<char *>(&out->at(0)), size);
    AAsset_close(asset);
    return true;
  } else {
    if (err) {
      (*err) += "No asset manager specified : " + filepath + "\n";
    }
    return false;
  }

#else
#ifdef _WIN32
#if defined(__GLIBCXX__)  // mingw
  int file_descriptor =
      _wopen(UTF8ToWchar(filepath).c_str(), _O_RDONLY | _O_BINARY);
  __gnu_cxx::stdio_filebuf<char> wfile_buf(file_descriptor, std::ios_base::in);
  std::istream f(&wfile_buf);
#elif defined(_MSC_VER) || defined(_LIBCPP_VERSION)
  // For libcxx, assume _LIBCPP_HAS_OPEN_WITH_WCHAR is defined to accept
  // `wchar_t *`
  std::ifstream f(UTF8ToWchar(filepath).c_str(), std::ifstream::binary);
#else
  // Unknown compiler/runtime
  std::ifstream f(filepath.c_str(), std::ifstream::binary);
#endif
#else
  std::ifstream f(filepath.c_str(), std::ifstream::binary);
#endif
  if (!f) {
    if (err) {
      (*err) += "File does not exit or open error : " + filepath + "\n";
    }
    return false;
  }

  // For directory(and pipe?), peek() will fail(Posix gnustl/libc++ only)
  int buf = f.peek();
  (void)buf;
  if (!f) {
    if (err) {
      (*err) +=
          "File read error. Maybe empty file or invalid file : " + filepath +
          "\n";
    }
    return false;
  }

  f.seekg(0, f.end);
  size_t sz = static_cast<size_t>(f.tellg());
  f.seekg(0, f.beg);

  if (int64_t(sz) < 0) {
    if (err) {
      (*err) += "Invalid file size : " + filepath +
                " (does the path point to a directory?)";
    }
    return false;
  } else if (sz == 0) {
    if (err) {
      (*err) += "File is empty : " + filepath + "\n";
    }
    return false;
  } else if (uint64_t(sz) >= uint64_t(std::numeric_limits<int64_t>::max())) {
    // Posixish environment.
    if (err) {
      (*err) += "Invalid File(Pipe or special device?) : " + filepath + "\n";
    }
    return false;
  }

  sz = (std::min)(size_t(max_read_bytes), sz);

  out->resize(sz);
  f.read(reinterpret_cast<char *>(&out->at(0)),
         static_cast<std::streamsize>(sz));

  if (!f) {
    // read failure.
    if (err) {
      (*err) += "Failed to read file: " + filepath + "\n";
    }
    return false;
  }

  return true;
#endif
}